

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fBasicComputeShaderTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_2::AtomicCounterCase::iterate(AtomicCounterCase *this)

{
  uint uVar1;
  RenderContext *renderCtx;
  int iVar2;
  ContextType type;
  GLSLVersion version;
  GLuint GVar3;
  deUint32 dVar4;
  GLenum GVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar7;
  undefined4 extraout_var_01;
  char *__s;
  size_t sVar8;
  ostream *poVar9;
  long *plVar10;
  TestError *pTVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  BufferMemMap bufMap;
  BufferMemMap bufMap_1;
  Buffer counterBuffer;
  Buffer outputBuffer;
  ShaderProgram program;
  BufferMemMap memMap;
  ostringstream src;
  undefined1 auStack_4d8 [12];
  int local_4cc;
  undefined1 local_4c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  BufferMemMap local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  ObjectWrapper local_448;
  ObjectWrapper local_430;
  string local_418;
  ShaderProgram local_3f8;
  undefined1 local_328 [8];
  pointer local_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  pointer local_308;
  deUint32 local_300;
  undefined8 local_2fc;
  uint uStack_2f4;
  int iStack_2f0;
  undefined5 uStack_2ec;
  undefined8 uStack_2e7;
  ios_base local_2b0 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_298;
  undefined1 local_278 [208];
  undefined1 local_1a8 [376];
  Functions *gl;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar2);
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pOVar7 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_430,(Functions *)CONCAT44(extraout_var_00,iVar2),pOVar7);
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pOVar7 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_448,(Functions *)CONCAT44(extraout_var_01,iVar2),pOVar7);
  uVar13 = (this->m_localSize).m_data[1] * (this->m_localSize).m_data[0] *
           (this->m_localSize).m_data[2] * (this->m_workSize).m_data[0] *
           (this->m_workSize).m_data[1] * (this->m_workSize).m_data[2];
  type.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion(type);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  __s = glu::getGLSLVersionDeclaration(version);
  if (__s == (char *)0x0) {
    std::ios::clear((int)(auStack_4d8 + (long)*(_func_int **)(local_1a8._0_8_ + -0x18)) + 0x330);
  }
  else {
    sVar8 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout (local_size_x = ",0x17);
  poVar9 = (ostream *)std::ostream::operator<<(local_1a8,(this->m_localSize).m_data[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,", local_size_y = ",0x11);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,(this->m_localSize).m_data[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,", local_size_z = ",0x11);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,(this->m_localSize).m_data[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,") in;\n",6);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,"layout(binding = 0) buffer Output {\n",0x24);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"    uint values[",0x10);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"];\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"} sb_out;\n\n",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,"layout(binding = 0, offset = 0) uniform atomic_uint u_count;\n\n",0x3e);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"void main (void) {\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,
             "    uint localSize  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_WorkGroupSize.z;\n",
             0x50);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,
             "    uint globalNdx  = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
             ,0x87);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,"    uint globalOffs = localSize*globalNdx;\n",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,
             "    uint localOffs  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_LocalInvocationID.z + gl_WorkGroupSize.x*gl_LocalInvocationID.y + gl_LocalInvocationID.x;\n"
             ,0x99);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,"    uint oldVal = atomicCounterIncrement(u_count);\n",0x33);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,"    sb_out.values[globalOffs+localOffs] = oldVal;\n",0x32);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"}\n",2);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(local_328,0,0xac);
  local_278._0_8_ = (pointer)0x0;
  local_278[8] = 0;
  local_278._9_7_ = 0;
  local_278[0x10] = 0;
  local_278._17_8_ = 0;
  std::__cxx11::stringbuf::str();
  local_4c8._0_4_ = 5;
  local_4c8._8_8_ = local_4b8._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_4c8 + 8),local_4a0._M_dataplus._M_p,
             local_4a0._M_dataplus._M_p + local_4a0._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_328 + (local_4c8._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_4c8 + 8));
  glu::ShaderProgram::ShaderProgram(&local_3f8,renderCtx,(ProgramSources *)local_328);
  if ((char *)local_4c8._8_8_ != local_4b8._M_local_buf + 8) {
    operator_delete((void *)local_4c8._8_8_,local_4b8._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
    operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_278);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_298);
  lVar17 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_328 + lVar17));
    lVar17 = lVar17 + -0x18;
  } while (lVar17 != -0x18);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,&local_3f8
                 );
  if (local_3f8.m_program.m_info.linkOk == false) {
    pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar11,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
               ,0x5f2);
    __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_328 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_320);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_320,"Work groups: ",0xd);
  tcu::operator<<((ostream *)&local_320,&this->m_workSize);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_320);
  std::ios_base::~ios_base(local_2b0);
  (*gl->useProgram)(local_3f8.m_program.m_program);
  GVar3 = (*gl->getProgramResourceIndex)(local_3f8.m_program.m_program,0x92e1,"u_count");
  dVar4 = glu::getProgramResourceUint(gl,local_3f8.m_program.m_program,0x92e1,GVar3,0x9301);
  dVar4 = glu::getProgramResourceUint(gl,local_3f8.m_program.m_program,0x92c0,dVar4,0x9303);
  (*gl->bindBuffer)(0x92c0,local_448.m_object);
  (*gl->bufferData)(0x92c0,(ulong)dVar4,(void *)0x0,0x88e1);
  BufferMemMap::BufferMemMap((BufferMemMap *)local_328,gl,0x92c0,0,dVar4,2);
  memset((void *)CONCAT71(local_318._M_allocated_capacity._1_7_,local_318._M_local_buf[0]),0,
         (long)(int)dVar4);
  (*(code *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((long)local_328 + 0x1670))->_M_allocated_capacity)((ulong)local_320 & 0xffffffff);
  (*gl->bindBufferBase)(0x92c0,0,local_448.m_object);
  GVar5 = (*gl->getError)();
  glu::checkError(GVar5,"Atomic counter buffer setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0x607);
  GVar3 = (*gl->getProgramResourceIndex)(local_3f8.m_program.m_program,0x92e6,"Output");
  dVar4 = glu::getProgramResourceUint(gl,local_3f8.m_program.m_program,0x92e6,GVar3,0x9303);
  (*gl->bindBuffer)(0x90d2,local_430.m_object);
  (*gl->bufferData)(0x90d2,(long)(int)dVar4,(void *)0x0,0x88e1);
  (*gl->bindBufferBase)(0x90d2,0,local_430.m_object);
  GVar5 = (*gl->getError)();
  glu::checkError(GVar5,"Output buffer setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0x612);
  (*gl->dispatchCompute)
            ((this->m_workSize).m_data[0],(this->m_workSize).m_data[1],(this->m_workSize).m_data[2])
  ;
  GVar5 = (*gl->getError)();
  glu::checkError(GVar5,"glDispatchCompute()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0x617);
  GVar3 = (*gl->getProgramResourceIndex)(local_3f8.m_program.m_program,0x92e1,"u_count");
  dVar4 = glu::getProgramResourceUint(gl,local_3f8.m_program.m_program,0x92e1,GVar3,0x92fc);
  dVar6 = glu::getProgramResourceUint(gl,local_3f8.m_program.m_program,0x92e1,GVar3,0x9301);
  dVar6 = glu::getProgramResourceUint(gl,local_3f8.m_program.m_program,0x92c0,dVar6,0x9303);
  BufferMemMap::BufferMemMap((BufferMemMap *)local_4c8,gl,0x92c0,0,dVar6,1);
  if (*(uint *)(local_4b8._M_allocated_capacity + dVar4) != uVar13) {
    pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
    local_328 = (undefined1  [8])&local_318;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_328,"Invalid atomic counter value","");
    tcu::TestError::TestError(pTVar11,(string *)local_328);
    __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(glUnmapBufferFunc *)(local_4c8._0_8_ + 0x1670))(local_4c8._8_4_);
  GVar3 = (*gl->getProgramResourceIndex)(local_3f8.m_program.m_program,0x92e6,"Output");
  dVar4 = glu::getProgramResourceUint(gl,local_3f8.m_program.m_program,0x92e6,GVar3,0x9303);
  GVar3 = (*gl->getProgramResourceIndex)(local_3f8.m_program.m_program,0x92e5,"Output.values");
  local_320 = (pointer)0x0;
  local_318._M_local_buf[0] = '\0';
  local_308 = (pointer)&DAT_ffffffffffffffff;
  local_300 = 0xffffffff;
  local_2fc = 0;
  uStack_2f4 = 0;
  iStack_2f0 = 0;
  uStack_2ec = 0;
  uStack_2e7 = 0;
  local_328 = (undefined1  [8])&local_318;
  glu::getProgramInterfaceVariableInfo
            (gl,local_3f8.m_program.m_program,0x92e5,GVar3,(InterfaceVariableInfo *)local_328);
  BufferMemMap::BufferMemMap(&local_480,gl,0x90d2,0,dVar4,1);
  local_4cc = 0;
  if (0 < (int)uVar13) {
    iVar2 = 0;
    uVar15 = 0;
    iVar14 = 0;
    iVar16 = 0;
    do {
      uVar1 = *(uint *)((long)local_480.m_ptr + (long)iVar2 + (ulong)uStack_2f4);
      if (uVar13 <= uVar1) {
        pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
        local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_468,"Comparison failed for Output.values[","");
        de::toString<int>(&local_418,&local_4cc);
        std::operator+(&local_4a0,&local_468,&local_418);
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_4a0);
        local_4c8._0_8_ = *plVar10;
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c8._0_8_ == paVar12) {
          local_4b8._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_4b8._8_8_ = plVar10[3];
          local_4c8._0_8_ = &local_4b8;
        }
        else {
          local_4b8._M_allocated_capacity = paVar12->_M_allocated_capacity;
        }
        local_4c8._8_8_ = plVar10[1];
        *plVar10 = (long)paVar12;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        tcu::TestError::TestError(pTVar11,(string *)local_4c8);
        __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      iVar14 = iVar14 + (int)uVar15;
      iVar16 = iVar16 + uVar1;
      uVar15 = uVar15 + 1;
      local_4cc = (int)uVar15;
      iVar2 = iVar2 + iStack_2f0;
    } while (uVar13 != uVar15);
    if (iVar16 != iVar14) {
      pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
      local_4c8._0_8_ = &local_4b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4c8,"Total sum of values in Output.values doesn\'t match","");
      tcu::TestError::TestError(pTVar11,(string *)local_4c8);
      __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  (*(local_480.m_gl)->unmapBuffer)(local_480.m_target);
  if (local_328 != (undefined1  [8])&local_318) {
    operator_delete((void *)local_328,
                    CONCAT71(local_318._M_allocated_capacity._1_7_,local_318._M_local_buf[0]) + 1);
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  glu::ShaderProgram::~ShaderProgram(&local_3f8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  glu::ObjectWrapper::~ObjectWrapper(&local_448);
  glu::ObjectWrapper::~ObjectWrapper(&local_430);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
		const Buffer				outputBuffer	(m_context.getRenderContext());
		const Buffer				counterBuffer	(m_context.getRenderContext());
		const int					workGroupSize	= m_localSize[0]*m_localSize[1]*m_localSize[2];
		const int					workGroupCount	= m_workSize[0]*m_workSize[1]*m_workSize[2];
		const int					numValues		= workGroupSize*workGroupCount;

		const GLSLVersion			glslVersion		= glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType());
		std::ostringstream			src;

		src << getGLSLVersionDeclaration(glslVersion) << "\n"
			<< "layout (local_size_x = " << m_localSize[0] << ", local_size_y = " << m_localSize[1] << ", local_size_z = " << m_localSize[2] << ") in;\n"
			<< "layout(binding = 0) buffer Output {\n"
			<< "    uint values[" << numValues << "];\n"
			<< "} sb_out;\n\n"
			<< "layout(binding = 0, offset = 0) uniform atomic_uint u_count;\n\n"
			<< "void main (void) {\n"
			<< "    uint localSize  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_WorkGroupSize.z;\n"
			<< "    uint globalNdx  = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
			<< "    uint globalOffs = localSize*globalNdx;\n"
			<< "    uint localOffs  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_LocalInvocationID.z + gl_WorkGroupSize.x*gl_LocalInvocationID.y + gl_LocalInvocationID.x;\n"
			<< "\n"
			<< "    uint oldVal = atomicCounterIncrement(u_count);\n"
			<< "    sb_out.values[globalOffs+localOffs] = oldVal;\n"
			<< "}\n";

		const ShaderProgram			program			(m_context.getRenderContext(), ProgramSources() << ComputeSource(src.str()));

		m_testCtx.getLog() << program;
		if (!program.isOk())
			TCU_FAIL("Compile failed");

		m_testCtx.getLog() << TestLog::Message << "Work groups: " << m_workSize << TestLog::EndMessage;

		gl.useProgram(program.getProgram());

		// Atomic counter buffer setup
		{
			const deUint32	uniformIndex	= gl.getProgramResourceIndex(program.getProgram(), GL_UNIFORM, "u_count");
			const deUint32	bufferIndex		= getProgramResourceUint(gl, program.getProgram(), GL_UNIFORM, uniformIndex, GL_ATOMIC_COUNTER_BUFFER_INDEX);
			const deUint32	bufferSize		= getProgramResourceUint(gl, program.getProgram(), GL_ATOMIC_COUNTER_BUFFER, bufferIndex, GL_BUFFER_DATA_SIZE);

			gl.bindBuffer(GL_ATOMIC_COUNTER_BUFFER, *counterBuffer);
			gl.bufferData(GL_ATOMIC_COUNTER_BUFFER, bufferSize, DE_NULL, GL_STREAM_READ);

			{
				const BufferMemMap memMap(gl, GL_ATOMIC_COUNTER_BUFFER, 0, bufferSize, GL_MAP_WRITE_BIT);
				deMemset(memMap.getPtr(), 0, (int)bufferSize);
			}

			gl.bindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 0, *counterBuffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Atomic counter buffer setup failed");
		}

		// Output buffer setup
		{
			const deUint32		blockIndex		= gl.getProgramResourceIndex(program.getProgram(), GL_SHADER_STORAGE_BLOCK, "Output");
			const int			blockSize		= getProgramResourceInt(gl, program.getProgram(), GL_SHADER_STORAGE_BLOCK, blockIndex, GL_BUFFER_DATA_SIZE);

			gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *outputBuffer);
			gl.bufferData(GL_SHADER_STORAGE_BUFFER, blockSize, DE_NULL, GL_STREAM_READ);
			gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, *outputBuffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Output buffer setup failed");
		}

		// Dispatch compute workload
		gl.dispatchCompute(m_workSize[0], m_workSize[1], m_workSize[2]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute()");

		// Read back and compare atomic counter
		{
			const deUint32		uniformIndex	= gl.getProgramResourceIndex(program.getProgram(), GL_UNIFORM, "u_count");
			const deUint32		uniformOffset	= getProgramResourceUint(gl, program.getProgram(), GL_UNIFORM, uniformIndex, GL_OFFSET);
			const deUint32		bufferIndex		= getProgramResourceUint(gl, program.getProgram(), GL_UNIFORM, uniformIndex, GL_ATOMIC_COUNTER_BUFFER_INDEX);
			const deUint32		bufferSize		= getProgramResourceUint(gl, program.getProgram(), GL_ATOMIC_COUNTER_BUFFER, bufferIndex, GL_BUFFER_DATA_SIZE);
			const BufferMemMap	bufMap			(gl, GL_ATOMIC_COUNTER_BUFFER, 0, bufferSize, GL_MAP_READ_BIT);

			const deUint32		resVal			= *((const deUint32*)((const deUint8*)bufMap.getPtr() + uniformOffset));

			if (resVal != (deUint32)numValues)
				throw tcu::TestError("Invalid atomic counter value");
		}

		// Read back and compare SSBO
		{
			const deUint32				blockIndex	= gl.getProgramResourceIndex(program.getProgram(), GL_SHADER_STORAGE_BLOCK, "Output");
			const int					blockSize	= getProgramResourceInt(gl, program.getProgram(), GL_SHADER_STORAGE_BLOCK, blockIndex, GL_BUFFER_DATA_SIZE);
			const deUint32				valueIndex	= gl.getProgramResourceIndex(program.getProgram(), GL_BUFFER_VARIABLE, "Output.values");
			const InterfaceVariableInfo	valueInfo	= getProgramInterfaceVariableInfo(gl, program.getProgram(), GL_BUFFER_VARIABLE, valueIndex);
			const BufferMemMap			bufMap		(gl, GL_SHADER_STORAGE_BUFFER, 0, blockSize, GL_MAP_READ_BIT);
			deUint32					valSum		= 0;
			deUint32					refSum		= 0;

			for (int valNdx = 0; valNdx < numValues; valNdx++)
			{
				const deUint32 res = *((const deUint32*)((const deUint8*)bufMap.getPtr() + valueInfo.offset + valueInfo.arrayStride*valNdx));

				valSum += res;
				refSum += (deUint32)valNdx;

				if (!de::inBounds<deUint32>(res, 0, (deUint32)numValues))
					throw tcu::TestError(string("Comparison failed for Output.values[") + de::toString(valNdx) + "]");
			}

			if (valSum != refSum)
				throw tcu::TestError("Total sum of values in Output.values doesn't match");
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}